

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O0

json_bool lh_table_lookup_ex(lh_table *t,void *k,void **v)

{
  lh_entry *e_00;
  void *pvVar1;
  lh_entry *e;
  void **v_local;
  void *k_local;
  lh_table *t_local;
  
  e_00 = lh_table_lookup_entry(t,k);
  if (e_00 == (lh_entry *)0x0) {
    if (v != (void **)0x0) {
      *v = (void *)0x0;
    }
    t_local._4_4_ = 0;
  }
  else {
    if (v != (void **)0x0) {
      pvVar1 = lh_entry_v(e_00);
      *v = pvVar1;
    }
    t_local._4_4_ = 1;
  }
  return t_local._4_4_;
}

Assistant:

json_bool lh_table_lookup_ex(struct lh_table *t, const void *k, void **v)
{
	struct lh_entry *e = lh_table_lookup_entry(t, k);
	if (e != NULL)
	{
		if (v != NULL)
			*v = lh_entry_v(e);
		return 1; /* key found */
	}
	if (v != NULL)
		*v = NULL;
	return 0; /* key not found */
}